

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

void ssw_update_nparticles
               (mcpl_generic_wfilehandle_t *fh,int64_t np1pos,int32_t np1,int64_t nrsspos,
               int32_t nrss)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  uint64_t savedpos;
  undefined1 local_24 [4];
  undefined8 local_20;
  undefined1 local_14 [12];
  long local_8;
  
  uVar1 = *(undefined8 *)(in_RDI + 8);
  local_20 = in_RCX;
  local_8 = in_RDI;
  mcpl_generic_fwseek(in_RDI,in_RSI);
  mcpl_generic_fwrite(local_8,local_14,4);
  mcpl_generic_fwseek(local_8,local_20);
  mcpl_generic_fwrite(local_8,local_24,4);
  mcpl_generic_fwseek(local_8,uVar1);
  return;
}

Assistant:

void ssw_update_nparticles( mcpl_generic_wfilehandle_t* fh,
                            int64_t np1pos, int32_t np1,
                            int64_t nrsspos, int32_t nrss)
{
  //Seek and update np1 and nrss fields at correct location in header:
  uint64_t savedpos = fh->current_pos;
  mcpl_generic_fwseek( fh, np1pos );
  mcpl_generic_fwrite( fh, (char*)&np1, sizeof(np1) );
  mcpl_generic_fwseek( fh, nrsspos );
  mcpl_generic_fwrite( fh, (char*)&nrss, sizeof(nrss) );
  mcpl_generic_fwseek( fh, savedpos );
}